

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_uint64_field
          (OneofWellKnownTypes *this,UInt64Value *uint64_field)

{
  Arena *submessage_arena;
  Arena *message_arena;
  
  message_arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)message_arena & 1) != 0) {
    message_arena = *(Arena **)((ulong)message_arena & 0xfffffffffffffffe);
  }
  clear_oneof_field(this);
  if (uint64_field != (UInt64Value *)0x0) {
    submessage_arena =
         (Arena *)(uint64_field->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 1) != 0) {
      submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffe);
    }
    if (message_arena != submessage_arena) {
      uint64_field = (UInt64Value *)
                     google::protobuf::internal::GetOwnedMessageInternal
                               (message_arena,(MessageLite *)uint64_field,submessage_arena);
    }
    (this->field_0)._impl_._oneof_case_[0] = 0xd;
    (this->field_0)._impl_.oneof_field_.any_field_ = &uint64_field->super_Message;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_uint64_field(::google::protobuf::UInt64Value* PROTOBUF_NULLABLE uint64_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (uint64_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(uint64_field)->GetArena();
    if (message_arena != submessage_arena) {
      uint64_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, uint64_field, submessage_arena);
    }
    set_has_uint64_field();
    _impl_.oneof_field_.uint64_field_ = uint64_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.uint64_field)
}